

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9matfx.cpp
# Opt level: O3

void * rw::d3d9::matfxClose(void *o,int32 param_2,int32 param_3)

{
  rw::ObjPipeline::destroy(DAT_00149d00);
  DAT_00149d00 = (ObjPipeline *)0x0;
  return o;
}

Assistant:

static void*
matfxClose(void *o, int32, int32)
{
#ifdef RW_D3D9
	destroyMatFXShaders();
#endif

	((ObjPipeline*)matFXGlobals.pipelines[PLATFORM_D3D9])->destroy();
	matFXGlobals.pipelines[PLATFORM_D3D9] = nil;
	return o;
}